

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O3

void iutest::detail::PrintToFloatingPoint<float>(floating_point<float> *f,iu_ostream *os)

{
  uint uVar1;
  char cVar2;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  ostream *poVar17;
  size_t sVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  undefined1 auVar22 [16];
  short sVar24;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  iu_stringstream ss;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  undefined8 local_1d0;
  undefined1 local_1c8;
  long *local_1c0;
  long local_1b8;
  long local_1b0 [2];
  stringstream local_1a0 [16];
  long local_190;
  undefined8 local_188 [13];
  ios_base local_120 [264];
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  uint uVar23;
  undefined4 uVar25;
  undefined6 uVar26;
  undefined8 uVar27;
  undefined1 auVar28 [12];
  undefined1 auVar29 [14];
  undefined1 auVar32 [16];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 8;
  std::ostream::_M_insert<double>((double)(f->m_v).fv);
  std::__cxx11::stringbuf::str();
  poVar17 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_1c0,local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,"(0x",3);
  uVar1 = (f->m_v).uv;
  uVar21 = uVar1 >> 0x1c;
  uVar19 = uVar1 >> 0xc & 0xf;
  uVar20 = uVar1 >> 8 & 0xf;
  auVar31._0_8_ = CONCAT44(uVar1 >> 8,uVar1 >> 0xc) & 0xf0000000f;
  auVar31._8_4_ = uVar1 >> 4 & 0xf;
  auVar31._12_4_ = uVar1 & 0xf;
  uVar23 = uVar1 >> 0x18 & 0xf;
  auVar22._0_8_ = CONCAT44(uVar1 >> 0x18,uVar21) & 0xf0000000f;
  auVar22._8_4_ = uVar1 >> 0x14 & 0xf;
  auVar22._12_4_ = uVar1 >> 0x10 & 0xf;
  auVar30._0_4_ = -(uint)(9 < uVar21);
  auVar30._4_4_ = -(uint)(9 < uVar23);
  auVar30._8_4_ = -(uint)(9 < auVar22._8_4_);
  auVar30._12_4_ = -(uint)(9 < auVar22._12_4_);
  auVar33._0_4_ = -(uint)(9 < uVar19);
  auVar33._4_4_ = -(uint)(9 < uVar20);
  auVar33._8_4_ = -(uint)(9 < auVar31._8_4_);
  auVar33._12_4_ = -(uint)(9 < auVar31._12_4_);
  auVar35._0_4_ = uVar21 + 0x37;
  auVar35._4_4_ = uVar23 + 0x37;
  auVar35._8_4_ = auVar22._8_4_ + 0x37;
  auVar35._12_4_ = auVar22._12_4_ + 0x37;
  auVar34._0_4_ = uVar19 + 0x37;
  auVar34._4_4_ = uVar20 + 0x37;
  auVar34._8_4_ = auVar31._8_4_ + 0x37;
  auVar34._12_4_ = auVar31._12_4_ + 0x37;
  auVar34 = ~auVar33 & (auVar31 | _DAT_0014c080) | auVar34 & auVar33;
  auVar31 = ~auVar30 & (auVar22 | _DAT_0014c080) | auVar35 & auVar30;
  sVar10 = auVar31._0_2_;
  cVar2 = (0 < sVar10) * (sVar10 < 0x100) * auVar31[0] - (0xff < sVar10);
  sVar10 = auVar31._2_2_;
  sVar24 = CONCAT11((0 < sVar10) * (sVar10 < 0x100) * auVar31[2] - (0xff < sVar10),cVar2);
  sVar10 = auVar31._4_2_;
  cVar3 = (0 < sVar10) * (sVar10 < 0x100) * auVar31[4] - (0xff < sVar10);
  sVar10 = auVar31._6_2_;
  uVar25 = CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar31[6] - (0xff < sVar10),
                    CONCAT12(cVar3,sVar24));
  sVar10 = auVar31._8_2_;
  cVar4 = (0 < sVar10) * (sVar10 < 0x100) * auVar31[8] - (0xff < sVar10);
  sVar10 = auVar31._10_2_;
  uVar26 = CONCAT15((0 < sVar10) * (sVar10 < 0x100) * auVar31[10] - (0xff < sVar10),
                    CONCAT14(cVar4,uVar25));
  sVar10 = auVar31._12_2_;
  cVar5 = (0 < sVar10) * (sVar10 < 0x100) * auVar31[0xc] - (0xff < sVar10);
  sVar10 = auVar31._14_2_;
  uVar27 = CONCAT17((0 < sVar10) * (sVar10 < 0x100) * auVar31[0xe] - (0xff < sVar10),
                    CONCAT16(cVar5,uVar26));
  sVar10 = auVar34._0_2_;
  cVar6 = (0 < sVar10) * (sVar10 < 0x100) * auVar34[0] - (0xff < sVar10);
  sVar10 = auVar34._2_2_;
  auVar28._0_10_ =
       CONCAT19((0 < sVar10) * (sVar10 < 0x100) * auVar34[2] - (0xff < sVar10),
                CONCAT18(cVar6,uVar27));
  sVar10 = auVar34._4_2_;
  cVar7 = (0 < sVar10) * (sVar10 < 0x100) * auVar34[4] - (0xff < sVar10);
  auVar28[10] = cVar7;
  sVar10 = auVar34._6_2_;
  auVar28[0xb] = (0 < sVar10) * (sVar10 < 0x100) * auVar34[6] - (0xff < sVar10);
  sVar10 = auVar34._8_2_;
  cVar8 = (0 < sVar10) * (sVar10 < 0x100) * auVar34[8] - (0xff < sVar10);
  auVar29[0xc] = cVar8;
  auVar29._0_12_ = auVar28;
  sVar10 = auVar34._10_2_;
  auVar29[0xd] = (0 < sVar10) * (sVar10 < 0x100) * auVar34[10] - (0xff < sVar10);
  sVar10 = auVar34._12_2_;
  cVar9 = (0 < sVar10) * (sVar10 < 0x100) * auVar34[0xc] - (0xff < sVar10);
  auVar32[0xe] = cVar9;
  auVar32._0_14_ = auVar29;
  sVar10 = auVar34._14_2_;
  auVar32[0xf] = (0 < sVar10) * (sVar10 < 0x100) * auVar34[0xe] - (0xff < sVar10);
  sVar10 = (short)((uint)uVar25 >> 0x10);
  sVar11 = (short)((uint6)uVar26 >> 0x20);
  sVar12 = (short)((ulong)uVar27 >> 0x30);
  sVar13 = (short)((unkuint10)auVar28._0_10_ >> 0x40);
  sVar14 = auVar28._10_2_;
  sVar15 = auVar29._12_2_;
  sVar16 = auVar32._14_2_;
  local_1d0 = CONCAT17((0 < sVar16) * (sVar16 < 0x100) * cVar9 - (0xff < sVar16),
                       CONCAT16((0 < sVar15) * (sVar15 < 0x100) * cVar8 - (0xff < sVar15),
                                CONCAT15((0 < sVar14) * (sVar14 < 0x100) * cVar7 - (0xff < sVar14),
                                         CONCAT14((0 < sVar13) * (sVar13 < 0x100) * cVar6 -
                                                  (0xff < sVar13),
                                                  CONCAT13((0 < sVar12) * (sVar12 < 0x100) * cVar5 -
                                                           (0xff < sVar12),
                                                           CONCAT12((0 < sVar11) * (sVar11 < 0x100)
                                                                    * cVar4 - (0xff < sVar11),
                                                                    CONCAT11((0 < sVar10) *
                                                                             (sVar10 < 0x100) *
                                                                             cVar3 - (0xff < sVar10)
                                                                             ,(0 < sVar24) *
                                                                              (sVar24 < 0x100) *
                                                                              cVar2 - (0xff < sVar24
                                                                                      ))))))));
  local_1c8 = 0;
  local_1f0 = local_1e0;
  sVar18 = strlen((char *)&local_1d0);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,&local_1d0,(long)&local_1d0 + sVar18);
  poVar17 = std::__ostream_insert<char,std::char_traits<char>>(poVar17,(char *)local_1f0,local_1e8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar17,")",1);
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

inline void PrintToFloatingPoint(const floating_point<T>& f, iu_ostream* os)
{
    iu_stringstream ss;
#if IUTEST_HAS_IOMANIP
    ss << ::std::setprecision(::std::numeric_limits<T>::digits10 + 2);
#endif
    UniversalPrint(f.raw(), &ss);
    *os << ss.str() << "(0x" << ToHexString(f.bits()) << ")";
}